

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O2

void __thiscall
opts::OptionContainer<float>::OptionContainer
          (OptionContainer<float> *this,char s_,string *l_,float *var_,string *help_,string *type_)

{
  float *def;
  string sStack_a8;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)l_);
  default_value_abi_cxx11_(&local_68,(OptionContainer<float> *)var_,def);
  std::__cxx11::string::string((string *)&local_88,(string *)type_);
  std::__cxx11::string::string((string *)&sStack_a8,(string *)help_);
  BasicOption::BasicOption(&this->super_BasicOption,s_,&local_48,&local_68,&local_88,&sStack_a8);
  std::__cxx11::string::~string((string *)&sStack_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_BasicOption)._vptr_BasicOption = (_func_int **)&PTR__BasicOption_001c3718;
  this->var = var_;
  return;
}

Assistant:

OptionContainer(char               s_,
                                    const std::string& l_,
                                    T&                 var_,
                                    const std::string& help_,
                                    const std::string& type_ = Traits<T>::type_string()):
                        BasicOption(s_, l_, default_value(var_), type_, help_),
                        var(&var_)                  {}